

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  byte bVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  undefined1 (*pauVar32) [32];
  ulong uVar33;
  ulong *puVar34;
  NodeRef root;
  long lVar35;
  long lVar36;
  undefined4 uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar75 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5d78;
  Precalculations local_5d71;
  ulong local_5d70;
  RayK<8> *local_5d68;
  RayQueryContext *local_5d60;
  size_t local_5d58;
  undefined4 local_5d50;
  uint local_5d4c;
  RayK<8> *local_5d48;
  Geometry *local_5d40;
  RTCFilterFunctionNArguments local_5d38;
  BVH *local_5d08;
  Intersectors *local_5d00;
  ulong local_5cf8;
  long local_5cf0;
  long local_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ca0;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  int local_5b80;
  int iStack_5b7c;
  int iStack_5b78;
  int iStack_5b74;
  int iStack_5b70;
  int iStack_5b6c;
  int iStack_5b68;
  int iStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [8];
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined1 local_5a20 [8];
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a00;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  uint local_5920;
  uint uStack_591c;
  uint uStack_5918;
  uint uStack_5914;
  uint uStack_5910;
  uint uStack_590c;
  uint uStack_5908;
  uint uStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58e0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58c0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58a0;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d08 = (BVH *)This->ptr;
  local_5808 = (local_5d08->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar40 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar74 = ZEXT816(0) << 0x40;
      uVar39 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar74),5);
      uVar38 = vpcmpeqd_avx512vl(auVar40,(undefined1  [32])valid_i->field_0);
      uVar39 = uVar39 & uVar38;
      bVar28 = (byte)uVar39;
      if (bVar28 != 0) {
        local_5ca0._0_8_ = *(undefined8 *)ray;
        local_5ca0._8_8_ = *(undefined8 *)(ray + 8);
        local_5ca0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5ca0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5ca0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5ca0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5ca0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5ca0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5ca0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5ca0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5ca0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5ca0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5c40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5c20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar79 = ZEXT3264(auVar40);
        vandps_avx512vl(local_5c40,auVar40);
        auVar65._8_4_ = 0x219392ef;
        auVar65._0_8_ = 0x219392ef219392ef;
        auVar65._12_4_ = 0x219392ef;
        auVar65._16_4_ = 0x219392ef;
        auVar65._20_4_ = 0x219392ef;
        auVar65._24_4_ = 0x219392ef;
        auVar65._28_4_ = 0x219392ef;
        uVar38 = vcmpps_avx512vl(auVar40,auVar65,1);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar80 = ZEXT3264(auVar41);
        auVar42 = vdivps_avx512vl(auVar41,local_5c40);
        vandps_avx512vl(local_5c20,auVar40);
        uVar17 = vcmpps_avx512vl(auVar42,auVar65,1);
        auVar43 = vdivps_avx512vl(auVar41,local_5c20);
        vandps_avx512vl(local_5c00,auVar40);
        uVar18 = vcmpps_avx512vl(auVar43,auVar65,1);
        auVar40 = vdivps_avx512vl(auVar41,local_5c00);
        auVar75 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar27 = (bool)((byte)uVar38 & 1);
        local_5be0._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._0_4_;
        bVar27 = (bool)((byte)(uVar38 >> 1) & 1);
        local_5be0._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._4_4_;
        bVar27 = (bool)((byte)(uVar38 >> 2) & 1);
        fStack_5bd8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._8_4_);
        bVar27 = (bool)((byte)(uVar38 >> 3) & 1);
        fStack_5bd4 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._12_4_);
        bVar27 = (bool)((byte)(uVar38 >> 4) & 1);
        fStack_5bd0 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._16_4_);
        bVar27 = (bool)((byte)(uVar38 >> 5) & 1);
        fStack_5bcc = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._20_4_);
        bVar27 = (bool)((byte)(uVar38 >> 6) & 1);
        fStack_5bc8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._24_4_);
        bVar27 = SUB81(uVar38 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar42._28_4_;
        bVar27 = (bool)((byte)uVar17 & 1);
        local_5bc0._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._0_4_;
        bVar27 = (bool)((byte)(uVar17 >> 1) & 1);
        local_5bc0._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._4_4_;
        bVar27 = (bool)((byte)(uVar17 >> 2) & 1);
        fStack_5bb8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._8_4_);
        bVar27 = (bool)((byte)(uVar17 >> 3) & 1);
        fStack_5bb4 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._12_4_);
        bVar27 = (bool)((byte)(uVar17 >> 4) & 1);
        fStack_5bb0 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._16_4_);
        bVar27 = (bool)((byte)(uVar17 >> 5) & 1);
        fStack_5bac = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._20_4_);
        bVar27 = (bool)((byte)(uVar17 >> 6) & 1);
        fStack_5ba8 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._24_4_);
        bVar27 = SUB81(uVar17 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar43._28_4_;
        bVar27 = (bool)((byte)uVar18 & 1);
        local_5ba0._0_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._0_4_;
        bVar27 = (bool)((byte)(uVar18 >> 1) & 1);
        local_5ba0._4_4_ = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._4_4_;
        bVar27 = (bool)((byte)(uVar18 >> 2) & 1);
        fStack_5b98 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._8_4_);
        bVar27 = (bool)((byte)(uVar18 >> 3) & 1);
        fStack_5b94 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._12_4_);
        bVar27 = (bool)((byte)(uVar18 >> 4) & 1);
        fStack_5b90 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._16_4_);
        bVar27 = (bool)((byte)(uVar18 >> 5) & 1);
        fStack_5b8c = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._20_4_);
        bVar27 = (bool)((byte)(uVar18 >> 6) & 1);
        fStack_5b88 = (float)((uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._24_4_);
        bVar27 = SUB81(uVar18 >> 7,0);
        register0x00000918 = (uint)bVar27 * 0x5d5e0b6b | (uint)!bVar27 * auVar40._28_4_;
        uVar38 = vcmpps_avx512vl(_local_5be0,ZEXT1632(auVar74),1);
        auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5b80 = (uint)((byte)uVar38 & 1) * auVar40._0_4_;
        iStack_5b7c = (uint)((byte)(uVar38 >> 1) & 1) * auVar40._4_4_;
        iStack_5b78 = (uint)((byte)(uVar38 >> 2) & 1) * auVar40._8_4_;
        iStack_5b74 = (uint)((byte)(uVar38 >> 3) & 1) * auVar40._12_4_;
        iStack_5b70 = (uint)((byte)(uVar38 >> 4) & 1) * auVar40._16_4_;
        iStack_5b6c = (uint)((byte)(uVar38 >> 5) & 1) * auVar40._20_4_;
        iStack_5b68 = (uint)((byte)(uVar38 >> 6) & 1) * auVar40._24_4_;
        iStack_5b64 = (uint)(byte)(uVar38 >> 7) * auVar40._28_4_;
        auVar41 = ZEXT1632(auVar74);
        uVar38 = vcmpps_avx512vl(_local_5bc0,auVar41,5);
        auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar27 = (bool)((byte)uVar38 & 1);
        local_5b60 = (uint)bVar27 * auVar40._0_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_5b5c = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_5b58 = (uint)bVar27 * auVar40._8_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_5b54 = (uint)bVar27 * auVar40._12_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_5b50 = (uint)bVar27 * auVar40._16_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_5b4c = (uint)bVar27 * auVar40._20_4_ | (uint)!bVar27 * 0x60;
        bVar27 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_5b48 = (uint)bVar27 * auVar40._24_4_ | (uint)!bVar27 * 0x60;
        bVar27 = SUB81(uVar38 >> 7,0);
        uStack_5b44 = (uint)bVar27 * auVar40._28_4_ | (uint)!bVar27 * 0x60;
        uVar38 = vcmpps_avx512vl(_local_5ba0,auVar41,5);
        auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar27 = (bool)((byte)uVar38 & 1);
        local_5b40 = (uint)bVar27 * auVar40._0_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_5b3c = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_5b38 = (uint)bVar27 * auVar40._8_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_5b34 = (uint)bVar27 * auVar40._12_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_5b30 = (uint)bVar27 * auVar40._16_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_5b2c = (uint)bVar27 * auVar40._20_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_5b28 = (uint)bVar27 * auVar40._24_4_ | (uint)!bVar27 * 0xa0;
        bVar27 = SUB81(uVar38 >> 7,0);
        uStack_5b24 = (uint)bVar27 * auVar40._28_4_ | (uint)!bVar27 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar81 = ZEXT3264(local_4680);
        auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar41);
        local_5b20._0_4_ =
             (uint)(bVar28 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar28 & 1) * local_4680._0_4_;
        bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * local_4680._4_4_;
        bVar27 = (bool)((byte)(uVar39 >> 2) & 1);
        local_5b20._8_4_ = (uint)bVar27 * auVar40._8_4_ | (uint)!bVar27 * local_4680._8_4_;
        bVar27 = (bool)((byte)(uVar39 >> 3) & 1);
        local_5b20._12_4_ = (uint)bVar27 * auVar40._12_4_ | (uint)!bVar27 * local_4680._12_4_;
        bVar27 = (bool)((byte)(uVar39 >> 4) & 1);
        local_5b20._16_4_ = (uint)bVar27 * auVar40._16_4_ | (uint)!bVar27 * local_4680._16_4_;
        bVar27 = (bool)((byte)(uVar39 >> 5) & 1);
        local_5b20._20_4_ = (uint)bVar27 * auVar40._20_4_ | (uint)!bVar27 * local_4680._20_4_;
        bVar27 = (bool)((byte)(uVar39 >> 6) & 1);
        local_5b20._24_4_ = (uint)bVar27 * auVar40._24_4_ | (uint)!bVar27 * local_4680._24_4_;
        bVar27 = SUB81(uVar39 >> 7,0);
        local_5b20._28_4_ = (uint)bVar27 * auVar40._28_4_ | (uint)!bVar27 * local_4680._28_4_;
        local_5d50 = (undefined4)uVar39;
        auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar41);
        bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar39 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar39 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar39 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar39 >> 6) & 1);
        bVar9 = SUB81(uVar39 >> 7,0);
        local_5b00._4_4_ = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * -0x800000;
        local_5b00._0_4_ =
             (uint)(bVar28 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar28 & 1) * -0x800000;
        local_5b00._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * -0x800000;
        local_5b00._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * -0x800000;
        local_5b00._16_4_ = (uint)bVar6 * auVar40._16_4_ | (uint)!bVar6 * -0x800000;
        local_5b00._20_4_ = (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * -0x800000;
        local_5b00._24_4_ = (uint)bVar8 * auVar40._24_4_ | (uint)!bVar8 * -0x800000;
        local_5b00._28_4_ = (uint)bVar9 * auVar40._28_4_ | (uint)!bVar9 * -0x800000;
        local_5d78 = (uint)(byte)~bVar28;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar39 = 7;
        }
        else {
          uVar39 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d48 = ray + 0x100;
        puVar34 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar32 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5b20;
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar82 = ZEXT3264(auVar40);
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar83 = ZEXT3264(auVar40);
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar84 = ZEXT3264(auVar40);
        local_5d70 = uVar39;
        local_5d68 = ray;
        local_5d60 = context;
        local_5d00 = This;
LAB_01dd3f9d:
        do {
          do {
            root.ptr = puVar34[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd4b6f;
            puVar34 = puVar34 + -1;
            pauVar32 = pauVar32 + -1;
            auVar40 = *pauVar32;
            auVar78 = ZEXT3264(auVar40);
            uVar38 = vcmpps_avx512vl(auVar40,local_5b00,1);
          } while ((char)uVar38 == '\0');
          uVar37 = (undefined4)uVar38;
          if (uVar39 < (uint)POPCOUNT(uVar37)) {
LAB_01dd3fdd:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd4b6f;
                uVar19 = vcmpps_avx512vl(auVar78._0_32_,local_5b00,9);
                if ((char)uVar19 == '\0') goto LAB_01dd3f9d;
                local_5cf0 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar30 = (uint)(byte)~(byte)local_5d78;
                lVar35 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                lVar31 = 0;
                goto LAB_01dd41cb;
              }
              uVar38 = 8;
              auVar40 = auVar81._0_32_;
              for (lVar31 = 0;
                  (auVar78 = ZEXT3264(auVar40), lVar31 != 8 &&
                  (uVar17 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8), uVar17 != 8));
                  lVar31 = lVar31 + 1) {
                uVar37 = *(undefined4 *)(root.ptr + 0x40 + lVar31 * 4);
                auVar66._4_4_ = uVar37;
                auVar66._0_4_ = uVar37;
                auVar66._8_4_ = uVar37;
                auVar66._12_4_ = uVar37;
                auVar66._16_4_ = uVar37;
                auVar66._20_4_ = uVar37;
                auVar66._24_4_ = uVar37;
                auVar66._28_4_ = uVar37;
                auVar24._8_8_ = local_5ca0._8_8_;
                auVar24._0_8_ = local_5ca0._0_8_;
                auVar24._16_8_ = local_5ca0._16_8_;
                auVar24._24_8_ = local_5ca0._24_8_;
                auVar25._8_8_ = local_5ca0._40_8_;
                auVar25._0_8_ = local_5ca0._32_8_;
                auVar25._16_8_ = local_5ca0._48_8_;
                auVar25._24_8_ = local_5ca0._56_8_;
                auVar26._8_8_ = local_5ca0._72_8_;
                auVar26._0_8_ = local_5ca0._64_8_;
                auVar26._16_8_ = local_5ca0._80_8_;
                auVar26._24_8_ = local_5ca0._88_8_;
                auVar41 = vsubps_avx(auVar66,auVar24);
                auVar78._0_4_ = (float)local_5be0._0_4_ * auVar41._0_4_;
                auVar78._4_4_ = (float)local_5be0._4_4_ * auVar41._4_4_;
                auVar78._8_4_ = fStack_5bd8 * auVar41._8_4_;
                auVar78._12_4_ = fStack_5bd4 * auVar41._12_4_;
                auVar78._16_4_ = fStack_5bd0 * auVar41._16_4_;
                auVar78._20_4_ = fStack_5bcc * auVar41._20_4_;
                auVar78._28_36_ = auVar75._28_36_;
                auVar78._24_4_ = fStack_5bc8 * auVar41._24_4_;
                auVar65 = auVar78._0_32_;
                auVar75 = ZEXT3264(auVar65);
                uVar37 = *(undefined4 *)(root.ptr + 0x80 + lVar31 * 4);
                auVar67._4_4_ = uVar37;
                auVar67._0_4_ = uVar37;
                auVar67._8_4_ = uVar37;
                auVar67._12_4_ = uVar37;
                auVar67._16_4_ = uVar37;
                auVar67._20_4_ = uVar37;
                auVar67._24_4_ = uVar37;
                auVar67._28_4_ = uVar37;
                auVar41 = vsubps_avx(auVar67,auVar25);
                auVar76._0_4_ = (float)local_5bc0._0_4_ * auVar41._0_4_;
                auVar76._4_4_ = (float)local_5bc0._4_4_ * auVar41._4_4_;
                auVar76._8_4_ = fStack_5bb8 * auVar41._8_4_;
                auVar76._12_4_ = fStack_5bb4 * auVar41._12_4_;
                auVar76._16_4_ = fStack_5bb0 * auVar41._16_4_;
                auVar76._20_4_ = fStack_5bac * auVar41._20_4_;
                auVar76._28_36_ = in_ZMM7._28_36_;
                auVar76._24_4_ = fStack_5ba8 * auVar41._24_4_;
                auVar73 = auVar76._0_32_;
                in_ZMM7 = ZEXT3264(auVar73);
                uVar37 = *(undefined4 *)(root.ptr + 0xc0 + lVar31 * 4);
                auVar68._4_4_ = uVar37;
                auVar68._0_4_ = uVar37;
                auVar68._8_4_ = uVar37;
                auVar68._12_4_ = uVar37;
                auVar68._16_4_ = uVar37;
                auVar68._20_4_ = uVar37;
                auVar68._24_4_ = uVar37;
                auVar68._28_4_ = uVar37;
                auVar41 = vsubps_avx(auVar68,auVar26);
                auVar77._0_4_ = (float)local_5ba0._0_4_ * auVar41._0_4_;
                auVar77._4_4_ = (float)local_5ba0._4_4_ * auVar41._4_4_;
                auVar77._8_4_ = fStack_5b98 * auVar41._8_4_;
                auVar77._12_4_ = fStack_5b94 * auVar41._12_4_;
                auVar77._16_4_ = fStack_5b90 * auVar41._16_4_;
                auVar77._20_4_ = fStack_5b8c * auVar41._20_4_;
                auVar77._28_36_ = in_ZMM9._28_36_;
                auVar77._24_4_ = fStack_5b88 * auVar41._24_4_;
                auVar72 = auVar77._0_32_;
                in_ZMM9 = ZEXT3264(auVar72);
                uVar37 = *(undefined4 *)(root.ptr + 0x60 + lVar31 * 4);
                auVar69._4_4_ = uVar37;
                auVar69._0_4_ = uVar37;
                auVar69._8_4_ = uVar37;
                auVar69._12_4_ = uVar37;
                auVar69._16_4_ = uVar37;
                auVar69._20_4_ = uVar37;
                auVar69._24_4_ = uVar37;
                auVar69._28_4_ = uVar37;
                auVar41 = vsubps_avx(auVar69,auVar24);
                auVar62._4_4_ = (float)local_5be0._4_4_ * auVar41._4_4_;
                auVar62._0_4_ = (float)local_5be0._0_4_ * auVar41._0_4_;
                auVar62._8_4_ = fStack_5bd8 * auVar41._8_4_;
                auVar62._12_4_ = fStack_5bd4 * auVar41._12_4_;
                auVar62._16_4_ = fStack_5bd0 * auVar41._16_4_;
                auVar62._20_4_ = fStack_5bcc * auVar41._20_4_;
                auVar62._24_4_ = fStack_5bc8 * auVar41._24_4_;
                auVar62._28_4_ = (int)((ulong)local_5ca0._24_8_ >> 0x20);
                uVar37 = *(undefined4 *)(root.ptr + 0xa0 + lVar31 * 4);
                auVar70._4_4_ = uVar37;
                auVar70._0_4_ = uVar37;
                auVar70._8_4_ = uVar37;
                auVar70._12_4_ = uVar37;
                auVar70._16_4_ = uVar37;
                auVar70._20_4_ = uVar37;
                auVar70._24_4_ = uVar37;
                auVar70._28_4_ = uVar37;
                auVar41 = vsubps_avx(auVar70,auVar25);
                auVar63._4_4_ = (float)local_5bc0._4_4_ * auVar41._4_4_;
                auVar63._0_4_ = (float)local_5bc0._0_4_ * auVar41._0_4_;
                auVar63._8_4_ = fStack_5bb8 * auVar41._8_4_;
                auVar63._12_4_ = fStack_5bb4 * auVar41._12_4_;
                auVar63._16_4_ = fStack_5bb0 * auVar41._16_4_;
                auVar63._20_4_ = fStack_5bac * auVar41._20_4_;
                auVar63._24_4_ = fStack_5ba8 * auVar41._24_4_;
                auVar63._28_4_ = (int)((ulong)local_5ca0._56_8_ >> 0x20);
                uVar37 = *(undefined4 *)(root.ptr + 0xe0 + lVar31 * 4);
                auVar71._4_4_ = uVar37;
                auVar71._0_4_ = uVar37;
                auVar71._8_4_ = uVar37;
                auVar71._12_4_ = uVar37;
                auVar71._16_4_ = uVar37;
                auVar71._20_4_ = uVar37;
                auVar71._24_4_ = uVar37;
                auVar71._28_4_ = uVar37;
                auVar41 = vsubps_avx(auVar71,auVar26);
                auVar64._4_4_ = (float)local_5ba0._4_4_ * auVar41._4_4_;
                auVar64._0_4_ = (float)local_5ba0._0_4_ * auVar41._0_4_;
                auVar64._8_4_ = fStack_5b98 * auVar41._8_4_;
                auVar64._12_4_ = fStack_5b94 * auVar41._12_4_;
                auVar64._16_4_ = fStack_5b90 * auVar41._16_4_;
                auVar64._20_4_ = fStack_5b8c * auVar41._20_4_;
                auVar64._24_4_ = fStack_5b88 * auVar41._24_4_;
                auVar64._28_4_ = (int)((ulong)local_5ca0._88_8_ >> 0x20);
                auVar41 = vminps_avx(auVar65,auVar62);
                auVar42 = vminps_avx(auVar73,auVar63);
                auVar41 = vmaxps_avx(auVar41,auVar42);
                auVar42 = vminps_avx(auVar72,auVar64);
                auVar41 = vmaxps_avx(auVar41,auVar42);
                auVar43 = vmulps_avx512vl(auVar41,auVar82._0_32_);
                auVar41 = vmaxps_avx(auVar65,auVar62);
                auVar42 = vmaxps_avx(auVar73,auVar63);
                auVar42 = vminps_avx(auVar41,auVar42);
                auVar41 = vmaxps_avx(auVar72,auVar64);
                auVar41 = vminps_avx(auVar42,auVar41);
                auVar42 = vmulps_avx512vl(auVar41,auVar83._0_32_);
                auVar41 = vmaxps_avx(auVar43,local_5b20);
                auVar42 = vminps_avx(auVar42,local_5b00);
                uVar18 = vcmpps_avx512vl(auVar41,auVar42,2);
                uVar33 = uVar38;
                auVar44 = auVar40;
                if ((byte)uVar18 != 0) {
                  auVar41 = vblendmps_avx512vl(auVar81._0_32_,auVar43);
                  bVar27 = (bool)((byte)uVar18 & 1);
                  auVar44._0_4_ = (uint)bVar27 * auVar41._0_4_ | (uint)!bVar27 * auVar43._0_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 1) & 1);
                  auVar44._4_4_ = (uint)bVar27 * auVar41._4_4_ | (uint)!bVar27 * auVar43._4_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 2) & 1);
                  auVar44._8_4_ = (uint)bVar27 * auVar41._8_4_ | (uint)!bVar27 * auVar43._8_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 3) & 1);
                  auVar44._12_4_ = (uint)bVar27 * auVar41._12_4_ | (uint)!bVar27 * auVar43._12_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 4) & 1);
                  auVar44._16_4_ = (uint)bVar27 * auVar41._16_4_ | (uint)!bVar27 * auVar43._16_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 5) & 1);
                  auVar44._20_4_ = (uint)bVar27 * auVar41._20_4_ | (uint)!bVar27 * auVar43._20_4_;
                  bVar27 = (bool)((byte)(uVar18 >> 6) & 1);
                  auVar44._24_4_ = (uint)bVar27 * auVar41._24_4_ | (uint)!bVar27 * auVar43._24_4_;
                  bVar27 = SUB81(uVar18 >> 7,0);
                  auVar44._28_4_ = (uint)bVar27 * auVar41._28_4_ | (uint)!bVar27 * auVar43._28_4_;
                  uVar33 = uVar17;
                  if (uVar38 != 8) {
                    *puVar34 = uVar38;
                    puVar34 = puVar34 + 1;
                    *pauVar32 = auVar40;
                    pauVar32 = pauVar32 + 1;
                  }
                }
                auVar40 = auVar44;
                uVar38 = uVar33;
              }
              if (uVar38 == 8) goto LAB_01dd4167;
              uVar19 = vcmpps_avx512vl(auVar40,local_5b00,9);
              root.ptr = uVar38;
            } while ((byte)uVar39 < (byte)POPCOUNT((int)uVar19));
            *puVar34 = uVar38;
            puVar34 = puVar34 + 1;
            *pauVar32 = auVar40;
            pauVar32 = pauVar32 + 1;
LAB_01dd4167:
            iVar29 = 4;
          }
          else {
            while (local_5ce0 = auVar40, bVar28 = (byte)local_5d78, uVar38 != 0) {
              local_5d58 = 0;
              for (uVar39 = uVar38; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                local_5d58 = local_5d58 + 1;
              }
              uVar38 = uVar38 - 1 & uVar38;
              auVar75 = ZEXT1664(auVar75._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar27 = occluded1(local_5d00,local_5d08,root,local_5d58,&local_5d71,local_5d68,
                                 (TravRayK<8,_true> *)&local_5ca0.field_0,context);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar84 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar81 = ZEXT3264(auVar40);
              bVar23 = (byte)(1 << ((uint)local_5d58 & 0x1f));
              if (!bVar27) {
                bVar23 = 0;
              }
              local_5d78 = (uint)(bVar28 | bVar23);
              ray = local_5d68;
              uVar39 = local_5d70;
              context = local_5d60;
              auVar40 = local_5ce0;
            }
            iVar29 = 3;
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar82 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar83 = ZEXT3264(auVar40);
            auVar78 = ZEXT3264(local_5ce0);
            if (bVar28 != 0xff) {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5b00._0_4_ =
                   (uint)(bVar28 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar28 & 1) * local_5b00._0_4_
              ;
              bVar27 = (bool)((byte)(local_5d78 >> 1) & 1);
              local_5b00._4_4_ = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * local_5b00._4_4_;
              bVar27 = (bool)((byte)(local_5d78 >> 2) & 1);
              local_5b00._8_4_ = (uint)bVar27 * auVar40._8_4_ | (uint)!bVar27 * local_5b00._8_4_;
              bVar27 = (bool)((byte)(local_5d78 >> 3) & 1);
              local_5b00._12_4_ = (uint)bVar27 * auVar40._12_4_ | (uint)!bVar27 * local_5b00._12_4_;
              bVar27 = (bool)((byte)(local_5d78 >> 4) & 1);
              local_5b00._16_4_ = (uint)bVar27 * auVar40._16_4_ | (uint)!bVar27 * local_5b00._16_4_;
              bVar27 = (bool)((byte)(local_5d78 >> 5) & 1);
              local_5b00._20_4_ = (uint)bVar27 * auVar40._20_4_ | (uint)!bVar27 * local_5b00._20_4_;
              bVar27 = (bool)((byte)(local_5d78 >> 6) & 1);
              local_5b00._24_4_ = (uint)bVar27 * auVar40._24_4_ | (uint)!bVar27 * local_5b00._24_4_;
              local_5b00._28_4_ =
                   (local_5d78 >> 7) * auVar40._28_4_ |
                   (uint)!SUB41(local_5d78 >> 7,0) * local_5b00._28_4_;
              iVar29 = 2;
            }
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar40);
            if ((uint)uVar39 < (uint)POPCOUNT(uVar37)) goto LAB_01dd3fdd;
          }
        } while ((iVar29 == 4) || (iVar29 == 2));
LAB_01dd4b6f:
        bVar28 = (byte)local_5d78;
LAB_01dd4b77:
        bVar28 = bVar28 & (byte)local_5d50;
        bVar27 = (bool)(bVar28 >> 1 & 1);
        bVar4 = (bool)(bVar28 >> 2 & 1);
        bVar5 = (bool)(bVar28 >> 3 & 1);
        bVar6 = (bool)(bVar28 >> 4 & 1);
        bVar7 = (bool)(bVar28 >> 5 & 1);
        bVar8 = (bool)(bVar28 >> 6 & 1);
        *(uint *)local_5d48 =
             (uint)(bVar28 & 1) * -0x800000 | (uint)!(bool)(bVar28 & 1) * *(int *)local_5d48;
        *(uint *)(local_5d48 + 4) =
             (uint)bVar27 * -0x800000 | (uint)!bVar27 * *(int *)(local_5d48 + 4);
        *(uint *)(local_5d48 + 8) =
             (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5d48 + 8);
        *(uint *)(local_5d48 + 0xc) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5d48 + 0xc);
        *(uint *)(local_5d48 + 0x10) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5d48 + 0x10);
        *(uint *)(local_5d48 + 0x14) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5d48 + 0x14);
        *(uint *)(local_5d48 + 0x18) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5d48 + 0x18);
        *(uint *)(local_5d48 + 0x1c) =
             (uint)(bVar28 >> 7) * -0x800000 |
             (uint)!(bool)(bVar28 >> 7) * *(int *)(local_5d48 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01dd41cb:
  do {
    lVar36 = -0x10;
    uVar1 = uVar30;
    if (lVar31 == local_5cf0) goto LAB_01dd4a23;
    do {
      local_5ce8 = lVar31;
      local_5d4c = uVar1;
      if ((lVar36 == 0) || (uVar38 = (ulong)*(uint *)(lVar35 + lVar36), uVar38 == 0xffffffff))
      goto LAB_01dd4a02;
      uVar37 = *(undefined4 *)(lVar35 + -0x90 + lVar36);
      auVar72._4_4_ = uVar37;
      auVar72._0_4_ = uVar37;
      auVar72._8_4_ = uVar37;
      auVar72._12_4_ = uVar37;
      auVar72._16_4_ = uVar37;
      auVar72._20_4_ = uVar37;
      auVar72._24_4_ = uVar37;
      auVar72._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x80 + lVar36);
      auVar45._4_4_ = uVar37;
      auVar45._0_4_ = uVar37;
      auVar45._8_4_ = uVar37;
      auVar45._12_4_ = uVar37;
      auVar45._16_4_ = uVar37;
      auVar45._20_4_ = uVar37;
      auVar45._24_4_ = uVar37;
      auVar45._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x70 + lVar36);
      auVar46._4_4_ = uVar37;
      auVar46._0_4_ = uVar37;
      auVar46._8_4_ = uVar37;
      auVar46._12_4_ = uVar37;
      auVar46._16_4_ = uVar37;
      auVar46._20_4_ = uVar37;
      auVar46._24_4_ = uVar37;
      auVar46._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x60 + lVar36);
      auVar47._4_4_ = uVar37;
      auVar47._0_4_ = uVar37;
      auVar47._8_4_ = uVar37;
      auVar47._12_4_ = uVar37;
      auVar47._16_4_ = uVar37;
      auVar47._20_4_ = uVar37;
      auVar47._24_4_ = uVar37;
      auVar47._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x50 + lVar36);
      auVar48._4_4_ = uVar37;
      auVar48._0_4_ = uVar37;
      auVar48._8_4_ = uVar37;
      auVar48._12_4_ = uVar37;
      auVar48._16_4_ = uVar37;
      auVar48._20_4_ = uVar37;
      auVar48._24_4_ = uVar37;
      auVar48._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x40 + lVar36);
      auVar49._4_4_ = uVar37;
      auVar49._0_4_ = uVar37;
      auVar49._8_4_ = uVar37;
      auVar49._12_4_ = uVar37;
      auVar49._16_4_ = uVar37;
      auVar49._20_4_ = uVar37;
      auVar49._24_4_ = uVar37;
      auVar49._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x30 + lVar36);
      auVar50._4_4_ = uVar37;
      auVar50._0_4_ = uVar37;
      auVar50._8_4_ = uVar37;
      auVar50._12_4_ = uVar37;
      auVar50._16_4_ = uVar37;
      auVar50._20_4_ = uVar37;
      auVar50._24_4_ = uVar37;
      auVar50._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x20 + lVar36);
      auVar51._4_4_ = uVar37;
      auVar51._0_4_ = uVar37;
      auVar51._8_4_ = uVar37;
      auVar51._12_4_ = uVar37;
      auVar51._16_4_ = uVar37;
      auVar51._20_4_ = uVar37;
      auVar51._24_4_ = uVar37;
      auVar51._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar35 + -0x10 + lVar36);
      auVar52._4_4_ = uVar37;
      auVar52._0_4_ = uVar37;
      auVar52._8_4_ = uVar37;
      auVar52._12_4_ = uVar37;
      auVar52._16_4_ = uVar37;
      auVar52._20_4_ = uVar37;
      auVar52._24_4_ = uVar37;
      auVar52._28_4_ = uVar37;
      auVar40 = *(undefined1 (*) [32])ray;
      auVar41 = *(undefined1 (*) [32])(ray + 0x20);
      auVar42 = *(undefined1 (*) [32])(ray + 0x40);
      auVar43 = *(undefined1 (*) [32])(ray + 0x80);
      auVar75 = ZEXT3264(auVar43);
      auVar65 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar73 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar72 = vsubps_avx(auVar72,auVar40);
      auVar45 = vsubps_avx512vl(auVar45,auVar41);
      auVar46 = vsubps_avx512vl(auVar46,auVar42);
      in_ZMM7 = ZEXT3264(auVar46);
      auVar47 = vsubps_avx512vl(auVar47,auVar40);
      auVar48 = vsubps_avx512vl(auVar48,auVar41);
      auVar49 = vsubps_avx512vl(auVar49,auVar42);
      auVar50 = vsubps_avx512vl(auVar50,auVar40);
      auVar51 = vsubps_avx512vl(auVar51,auVar41);
      auVar42 = vsubps_avx512vl(auVar52,auVar42);
      auVar52 = vsubps_avx512vl(auVar50,auVar72);
      auVar53 = vsubps_avx512vl(auVar51,auVar45);
      auVar54 = vsubps_avx512vl(auVar42,auVar46);
      auVar55 = vsubps_avx512vl(auVar72,auVar47);
      auVar56 = vsubps_avx512vl(auVar45,auVar48);
      auVar57 = vsubps_avx512vl(auVar46,auVar49);
      auVar58 = vsubps_avx512vl(auVar47,auVar50);
      auVar59 = vsubps_avx512vl(auVar48,auVar51);
      auVar60 = vsubps_avx512vl(auVar49,auVar42);
      auVar41 = vaddps_avx512vl(auVar50,auVar72);
      auVar61 = vaddps_avx512vl(auVar51,auVar45);
      auVar40 = vaddps_avx512vl(auVar42,auVar46);
      auVar62 = vmulps_avx512vl(auVar61,auVar54);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar40);
      auVar40 = vmulps_avx512vl(auVar40,auVar52);
      auVar63 = vfmsub231ps_avx512vl(auVar40,auVar54,auVar41);
      auVar40._4_4_ = auVar41._4_4_ * auVar53._4_4_;
      auVar40._0_4_ = auVar41._0_4_ * auVar53._0_4_;
      auVar40._8_4_ = auVar41._8_4_ * auVar53._8_4_;
      auVar40._12_4_ = auVar41._12_4_ * auVar53._12_4_;
      auVar40._16_4_ = auVar41._16_4_ * auVar53._16_4_;
      auVar40._20_4_ = auVar41._20_4_ * auVar53._20_4_;
      auVar40._24_4_ = auVar41._24_4_ * auVar53._24_4_;
      auVar40._28_4_ = auVar41._28_4_;
      auVar74 = vfmsub231ps_fma(auVar40,auVar52,auVar61);
      fVar10 = auVar73._0_4_;
      auVar61._0_4_ = auVar74._0_4_ * fVar10;
      fVar11 = auVar73._4_4_;
      auVar61._4_4_ = auVar74._4_4_ * fVar11;
      fVar12 = auVar73._8_4_;
      auVar61._8_4_ = auVar74._8_4_ * fVar12;
      fVar13 = auVar73._12_4_;
      auVar61._12_4_ = auVar74._12_4_ * fVar13;
      fVar14 = auVar73._16_4_;
      auVar61._16_4_ = fVar14 * 0.0;
      fVar15 = auVar73._20_4_;
      auVar61._20_4_ = fVar15 * 0.0;
      fVar16 = auVar73._24_4_;
      auVar61._24_4_ = fVar16 * 0.0;
      auVar61._28_4_ = 0;
      auVar40 = vfmadd231ps_avx512vl(auVar61,auVar65,auVar63);
      auVar61 = vfmadd231ps_avx512vl(auVar40,auVar43,auVar62);
      in_ZMM9 = ZEXT3264(auVar61);
      auVar40 = vaddps_avx512vl(auVar72,auVar47);
      auVar41 = vaddps_avx512vl(auVar45,auVar48);
      auVar62 = vaddps_avx512vl(auVar46,auVar49);
      auVar63 = vmulps_avx512vl(auVar41,auVar57);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar62);
      auVar62 = vmulps_avx512vl(auVar62,auVar55);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar40);
      auVar40 = vmulps_avx512vl(auVar40,auVar56);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar55,auVar41);
      auVar41._4_4_ = auVar40._4_4_ * fVar11;
      auVar41._0_4_ = auVar40._0_4_ * fVar10;
      auVar41._8_4_ = auVar40._8_4_ * fVar12;
      auVar41._12_4_ = auVar40._12_4_ * fVar13;
      auVar41._16_4_ = auVar40._16_4_ * fVar14;
      auVar41._20_4_ = auVar40._20_4_ * fVar15;
      auVar41._24_4_ = auVar40._24_4_ * fVar16;
      auVar41._28_4_ = auVar40._28_4_;
      auVar40 = vfmadd231ps_avx512vl(auVar41,auVar65,auVar62);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar41 = vfmadd231ps_avx512vl(auVar40,auVar43,auVar63);
      auVar40 = vaddps_avx512vl(auVar47,auVar50);
      auVar47 = vaddps_avx512vl(auVar48,auVar51);
      auVar42 = vaddps_avx512vl(auVar49,auVar42);
      auVar48 = vmulps_avx512vl(auVar47,auVar60);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar59,auVar42);
      auVar42 = vmulps_avx512vl(auVar42,auVar58);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar60,auVar40);
      auVar40 = vmulps_avx512vl(auVar40,auVar59);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar58,auVar47);
      auVar40 = vmulps_avx512vl(auVar40,auVar73);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar65,auVar42);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar43,auVar48);
      auVar42 = vaddps_avx512vl(auVar61,auVar41);
      auVar49 = vaddps_avx512vl(auVar40,auVar42);
      auVar50 = auVar79._0_32_;
      vandps_avx512vl(auVar49,auVar50);
      auVar42 = vmulps_avx512vl(auVar49,auVar84._0_32_);
      auVar47 = vminps_avx512vl(auVar61,auVar41);
      auVar47 = vminps_avx512vl(auVar47,auVar40);
      auVar48 = vxorps_avx512vl(auVar42,auVar62);
      uVar19 = vcmpps_avx512vl(auVar47,auVar48,5);
      auVar47 = vmaxps_avx512vl(auVar61,auVar41);
      auVar40 = vmaxps_avx512vl(auVar47,auVar40);
      uVar20 = vcmpps_avx512vl(auVar40,auVar42,2);
      bVar28 = ((byte)uVar19 | (byte)uVar20) & (byte)uVar30;
      local_5d58 = CONCAT44(local_5d58._4_4_,uVar30);
      auVar42 = auVar80._0_32_;
      if (bVar28 == 0) {
LAB_01dd45b3:
        auVar49 = auVar40;
        bVar28 = 0;
        auVar54 = local_5ae0;
        auVar55 = local_5ac0;
        auVar56 = local_5aa0;
        auVar43 = local_5a80;
        auVar65 = local_5a60;
        auVar41 = _local_5a40;
        auVar73 = _local_5a20;
      }
      else {
        auVar40 = vmulps_avx512vl(auVar56,auVar54);
        auVar47 = vmulps_avx512vl(auVar52,auVar57);
        auVar48 = vmulps_avx512vl(auVar55,auVar53);
        auVar51 = vmulps_avx512vl(auVar59,auVar57);
        auVar63 = vmulps_avx512vl(auVar55,auVar60);
        auVar64 = vmulps_avx512vl(auVar58,auVar56);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar57,auVar40);
        auVar54 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar47);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar48);
        auVar60 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar51);
        auVar57 = vfmsub213ps_avx512vl(auVar58,auVar57,auVar63);
        auVar58 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar64);
        vandps_avx512vl(auVar40,auVar50);
        vandps_avx512vl(auVar51,auVar50);
        uVar17 = vcmpps_avx512vl(auVar58,auVar58,1);
        vandps_avx512vl(auVar47,auVar50);
        vandps_avx512vl(auVar63,auVar50);
        uVar18 = vcmpps_avx512vl(auVar58,auVar58,1);
        vandps_avx512vl(auVar48,auVar50);
        vandps_avx512vl(auVar64,auVar50);
        uVar33 = vcmpps_avx512vl(auVar58,auVar58,1);
        bVar27 = (bool)((byte)uVar17 & 1);
        auVar56._0_4_ = (uint)bVar27 * auVar53._0_4_ | (uint)!bVar27 * auVar60._0_4_;
        bVar27 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar27 * auVar53._4_4_ | (uint)!bVar27 * auVar60._4_4_;
        bVar27 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar27 * auVar53._8_4_ | (uint)!bVar27 * auVar60._8_4_;
        bVar27 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar27 * auVar53._12_4_ | (uint)!bVar27 * auVar60._12_4_;
        bVar27 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar27 * auVar53._16_4_ | (uint)!bVar27 * auVar60._16_4_;
        bVar27 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar27 * auVar53._20_4_ | (uint)!bVar27 * auVar60._20_4_;
        bVar27 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar27 * auVar53._24_4_ | (uint)!bVar27 * auVar60._24_4_;
        bVar27 = SUB81(uVar17 >> 7,0);
        auVar56._28_4_ = (uint)bVar27 * auVar53._28_4_ | (uint)!bVar27 * auVar60._28_4_;
        bVar27 = (bool)((byte)uVar18 & 1);
        auVar55._0_4_ = (uint)bVar27 * auVar54._0_4_ | (uint)!bVar27 * auVar57._0_4_;
        bVar27 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar27 * auVar54._4_4_ | (uint)!bVar27 * auVar57._4_4_;
        bVar27 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar27 * auVar54._8_4_ | (uint)!bVar27 * auVar57._8_4_;
        bVar27 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar27 * auVar54._12_4_ | (uint)!bVar27 * auVar57._12_4_;
        bVar27 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar27 * auVar54._16_4_ | (uint)!bVar27 * auVar57._16_4_;
        bVar27 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar27 * auVar54._20_4_ | (uint)!bVar27 * auVar57._20_4_;
        bVar27 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar27 * auVar54._24_4_ | (uint)!bVar27 * auVar57._24_4_;
        bVar27 = SUB81(uVar18 >> 7,0);
        auVar55._28_4_ = (uint)bVar27 * auVar54._28_4_ | (uint)!bVar27 * auVar57._28_4_;
        bVar27 = (bool)((byte)uVar33 & 1);
        auVar54._0_4_ = (float)((uint)bVar27 * auVar52._0_4_ | (uint)!bVar27 * auVar58._0_4_);
        bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar54._4_4_ = (float)((uint)bVar27 * auVar52._4_4_ | (uint)!bVar27 * auVar58._4_4_);
        bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar54._8_4_ = (float)((uint)bVar27 * auVar52._8_4_ | (uint)!bVar27 * auVar58._8_4_);
        bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar54._12_4_ = (float)((uint)bVar27 * auVar52._12_4_ | (uint)!bVar27 * auVar58._12_4_);
        bVar27 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar54._16_4_ = (float)((uint)bVar27 * auVar52._16_4_ | (uint)!bVar27 * auVar58._16_4_);
        bVar27 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar54._20_4_ = (float)((uint)bVar27 * auVar52._20_4_ | (uint)!bVar27 * auVar58._20_4_);
        bVar27 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar54._24_4_ = (float)((uint)bVar27 * auVar52._24_4_ | (uint)!bVar27 * auVar58._24_4_);
        bVar27 = SUB81(uVar33 >> 7,0);
        auVar54._28_4_ = (uint)bVar27 * auVar52._28_4_ | (uint)!bVar27 * auVar58._28_4_;
        auVar53._4_4_ = fVar11 * auVar54._4_4_;
        auVar53._0_4_ = fVar10 * auVar54._0_4_;
        auVar53._8_4_ = fVar12 * auVar54._8_4_;
        auVar53._12_4_ = fVar13 * auVar54._12_4_;
        auVar53._16_4_ = fVar14 * auVar54._16_4_;
        auVar53._20_4_ = fVar15 * auVar54._20_4_;
        auVar53._24_4_ = fVar16 * auVar54._24_4_;
        auVar53._28_4_ = auVar73._28_4_;
        auVar74 = vfmadd213ps_fma(auVar65,auVar55,auVar53);
        auVar74 = vfmadd213ps_fma(auVar43,auVar56,ZEXT1632(auVar74));
        auVar73 = ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                     CONCAT48(auVar74._8_4_ + auVar74._8_4_,
                                              CONCAT44(auVar74._4_4_ + auVar74._4_4_,
                                                       auVar74._0_4_ + auVar74._0_4_))));
        auVar75 = ZEXT3264(auVar73);
        auVar43._0_4_ = auVar46._0_4_ * auVar54._0_4_;
        auVar43._4_4_ = auVar46._4_4_ * auVar54._4_4_;
        auVar43._8_4_ = auVar46._8_4_ * auVar54._8_4_;
        auVar43._12_4_ = auVar46._12_4_ * auVar54._12_4_;
        auVar43._16_4_ = auVar46._16_4_ * auVar54._16_4_;
        auVar43._20_4_ = auVar46._20_4_ * auVar54._20_4_;
        auVar43._24_4_ = auVar46._24_4_ * auVar54._24_4_;
        auVar43._28_4_ = 0;
        auVar74 = vfmadd213ps_fma(auVar45,auVar55,auVar43);
        auVar22 = vfmadd213ps_fma(auVar72,auVar56,ZEXT1632(auVar74));
        auVar43 = vrcp14ps_avx512vl(auVar73);
        auVar65 = vxorps_avx512vl(auVar73,auVar62);
        auVar40 = vfnmadd213ps_avx512vl(auVar43,auVar73,auVar42);
        auVar74 = vfmadd132ps_fma(auVar40,auVar43,auVar43);
        in_ZMM7 = ZEXT1664(auVar74);
        auVar43 = ZEXT1632(CONCAT412((auVar22._12_4_ + auVar22._12_4_) * auVar74._12_4_,
                                     CONCAT48((auVar22._8_4_ + auVar22._8_4_) * auVar74._8_4_,
                                              CONCAT44((auVar22._4_4_ + auVar22._4_4_) *
                                                       auVar74._4_4_,
                                                       (auVar22._0_4_ + auVar22._0_4_) *
                                                       auVar74._0_4_))));
        uVar19 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar20 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar21 = vcmpps_avx512vl(auVar73,auVar65,4);
        bVar28 = bVar28 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
        auVar65 = auVar49;
        auVar73 = auVar61;
        if (bVar28 == 0) goto LAB_01dd45b3;
      }
      _local_5a20 = auVar73;
      _local_5a40 = auVar41;
      local_5a60 = auVar65;
      local_5a80 = auVar43;
      local_5aa0 = auVar56;
      local_5ac0 = auVar55;
      local_5ae0 = auVar54;
      pGVar2 = (context->scene->geometries).items[uVar38].ptr;
      uVar1 = pGVar2->mask;
      auVar73._4_4_ = uVar1;
      auVar73._0_4_ = uVar1;
      auVar73._8_4_ = uVar1;
      auVar73._12_4_ = uVar1;
      auVar73._16_4_ = uVar1;
      auVar73._20_4_ = uVar1;
      auVar73._24_4_ = uVar1;
      auVar73._28_4_ = uVar1;
      uVar19 = vptestmd_avx512vl(auVar73,*(undefined1 (*) [32])(ray + 0x120));
      bVar28 = (byte)uVar19 & bVar28;
      if (bVar28 != 0) {
        local_5ce0._0_4_ = *(undefined4 *)(lVar35 + 0x10 + lVar36);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          vandps_avx512vl(local_5a60,auVar50);
          auVar57._8_4_ = 0x219392ef;
          auVar57._0_8_ = 0x219392ef219392ef;
          auVar57._12_4_ = 0x219392ef;
          auVar57._16_4_ = 0x219392ef;
          auVar57._20_4_ = 0x219392ef;
          auVar57._24_4_ = 0x219392ef;
          auVar57._28_4_ = 0x219392ef;
          uVar39 = vcmpps_avx512vl(auVar49,auVar57,5);
          auVar40 = vrcp14ps_avx512vl(local_5a60);
          auVar41 = vfnmadd213ps_avx512vl(auVar40,local_5a60,auVar42);
          auVar41 = vfmadd132ps_avx512vl(auVar41,auVar40,auVar40);
          fVar10 = (float)((uint)((byte)uVar39 & 1) * auVar41._0_4_);
          fVar16 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar41._4_4_);
          fVar15 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar41._8_4_);
          fVar14 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar41._12_4_);
          fVar13 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar41._16_4_);
          fVar12 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar41._20_4_);
          fVar11 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar41._24_4_);
          auVar58._4_4_ = fVar16 * (float)local_5a20._4_4_;
          auVar58._0_4_ = fVar10 * (float)local_5a20._0_4_;
          auVar58._8_4_ = fVar15 * fStack_5a18;
          auVar58._12_4_ = fVar14 * fStack_5a14;
          auVar58._16_4_ = fVar13 * fStack_5a10;
          auVar58._20_4_ = fVar12 * fStack_5a0c;
          auVar58._24_4_ = fVar11 * fStack_5a08;
          auVar58._28_4_ = auVar40._28_4_;
          local_5960 = vminps_avx512vl(auVar58,auVar42);
          auVar59._4_4_ = fVar16 * (float)local_5a40._4_4_;
          auVar59._0_4_ = fVar10 * (float)local_5a40._0_4_;
          auVar59._8_4_ = fVar15 * fStack_5a38;
          auVar59._12_4_ = fVar14 * fStack_5a34;
          auVar59._16_4_ = fVar13 * fStack_5a30;
          auVar59._20_4_ = fVar12 * fStack_5a2c;
          auVar59._24_4_ = fVar11 * fStack_5a28;
          auVar59._28_4_ = (uint)(byte)(uVar39 >> 7) * auVar41._28_4_;
          local_5980 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                       vminps_avx512vl(auVar59,auVar42);
          local_5a00._0_8_ = local_5aa0._0_8_;
          local_5a00._8_8_ = local_5aa0._8_8_;
          local_5a00._16_8_ = local_5aa0._16_8_;
          local_5a00._24_8_ = local_5aa0._24_8_;
          local_5a00._32_8_ = local_5ac0._0_8_;
          local_5a00._40_8_ = local_5ac0._8_8_;
          local_5a00._48_8_ = local_5ac0._16_8_;
          local_5a00._56_8_ = local_5ac0._24_8_;
          local_5a00._64_8_ = local_5ae0._0_8_;
          local_5a00._72_8_ = local_5ae0._8_8_;
          local_5a00._80_8_ = local_5ae0._16_8_;
          local_5a00._88_8_ = local_5ae0._24_8_;
          local_59a0 = local_5a80._0_8_;
          uStack_5998 = local_5a80._8_8_;
          uStack_5990 = local_5a80._16_8_;
          uStack_5988 = local_5a80._24_8_;
          local_5d38.valid = (int *)&local_5880;
          local_5d38.geometryUserPtr = &local_58e0;
          local_5d38.context = (RTCRayQueryContext *)&local_58c0;
          local_5d38.ray = (RTCRayN *)&local_58a0;
          auVar75 = ZEXT1664(auVar75._0_16_);
          in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
          in_ZMM9 = ZEXT1664(auVar61._0_16_);
          local_5d40 = pGVar2;
          local_5cf8 = uVar38;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5d38,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5a00.field_0);
          local_5940 = vpbroadcastd_avx512vl();
          local_5960 = vpbroadcastd_avx512vl();
          local_5a00._0_8_ = local_5880;
          local_5a00._8_8_ = uStack_5878;
          local_5a00._16_8_ = uStack_5870;
          local_5a00._24_8_ = uStack_5868;
          local_5a00._32_8_ = local_5860;
          local_5a00._40_8_ = uStack_5858;
          local_5a00._48_8_ = uStack_5850;
          local_5a00._56_8_ = uStack_5848;
          local_5a00._64_8_ = local_5840;
          local_5a00._72_8_ = uStack_5838;
          local_5a00._80_8_ = uStack_5830;
          local_5a00._88_8_ = uStack_5828;
          local_59a0 = local_58a0._0_8_;
          uStack_5998 = local_58a0._8_8_;
          uStack_5990 = local_58a0._16_8_;
          uStack_5988 = local_58a0._24_8_;
          local_5980 = local_58c0;
          vpcmpeqd_avx2(local_5940,local_5940);
          uStack_591c = local_5d60->user->instID[0];
          local_5920 = uStack_591c;
          uStack_5918 = uStack_591c;
          uStack_5914 = uStack_591c;
          uStack_5910 = uStack_591c;
          uStack_590c = uStack_591c;
          uStack_5908 = uStack_591c;
          uStack_5904 = uStack_591c;
          uStack_58fc = local_5d60->user->instPrimID[0];
          local_5900 = uStack_58fc;
          uStack_58f8 = uStack_58fc;
          uStack_58f4 = uStack_58fc;
          uStack_58f0 = uStack_58fc;
          uStack_58ec = uStack_58fc;
          uStack_58e8 = uStack_58fc;
          uStack_58e4 = uStack_58fc;
          local_5ce0 = *(undefined1 (*) [32])(local_5d68 + 0x100);
          auVar40 = vblendmps_avx512vl(local_5ce0,(undefined1  [32])local_58e0);
          bVar27 = (bool)(bVar28 >> 1 & 1);
          bVar4 = (bool)(bVar28 >> 2 & 1);
          bVar5 = (bool)(bVar28 >> 3 & 1);
          bVar6 = (bool)(bVar28 >> 4 & 1);
          bVar7 = (bool)(bVar28 >> 5 & 1);
          bVar8 = (bool)(bVar28 >> 6 & 1);
          *(uint *)(local_5d68 + 0x100) =
               (uint)(bVar28 & 1) * auVar40._0_4_ | !(bool)(bVar28 & 1) * uStack_58fc;
          *(uint *)(local_5d68 + 0x104) = (uint)bVar27 * auVar40._4_4_ | !bVar27 * uStack_58fc;
          *(uint *)(local_5d68 + 0x108) = (uint)bVar4 * auVar40._8_4_ | !bVar4 * uStack_58fc;
          *(uint *)(local_5d68 + 0x10c) = (uint)bVar5 * auVar40._12_4_ | !bVar5 * uStack_58fc;
          *(uint *)(local_5d68 + 0x110) = (uint)bVar6 * auVar40._16_4_ | !bVar6 * uStack_58fc;
          *(uint *)(local_5d68 + 0x114) = (uint)bVar7 * auVar40._20_4_ | !bVar7 * uStack_58fc;
          *(uint *)(local_5d68 + 0x118) = (uint)bVar8 * auVar40._24_4_ | !bVar8 * uStack_58fc;
          *(uint *)(local_5d68 + 0x11c) =
               (uint)(bVar28 >> 7) * auVar40._28_4_ | !(bool)(bVar28 >> 7) * uStack_58fc;
          local_5cc0 = vpmovm2d_avx512vl((ulong)bVar28);
          local_5d38.valid = (int *)local_5cc0;
          local_5d38.geometryUserPtr = local_5d40->userPtr;
          local_5d38.context = local_5d60->user;
          local_5d38.ray = (RTCRayN *)local_5d68;
          local_5d38.hit = (RTCHitN *)&local_5a00;
          local_5d38.N = 8;
          if (local_5d40->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar75 = ZEXT1664(auVar75._0_16_);
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            (*local_5d40->occlusionFilterN)(&local_5d38);
          }
          if (local_5cc0 == (undefined1  [32])0x0) {
            uVar39 = 0;
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar81 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar82 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar83 = ZEXT3264(auVar40);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar84 = ZEXT3264(auVar40);
          }
          else {
            p_Var3 = local_5d60->args->filter;
            if (p_Var3 == (RTCFilterFunctionN)0x0) {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar79 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar80 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar81 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar82 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar83 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar84 = ZEXT3264(auVar40);
            }
            else {
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar79 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar80 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar81 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar82 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar83 = ZEXT3264(auVar40);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar84 = ZEXT3264(auVar40);
              if (((local_5d60->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5d40->field_8).field_0x2 & 0x40) != 0)
                 ) {
                auVar75 = ZEXT1664(auVar75._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (*p_Var3)(&local_5d38);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar84 = ZEXT3264(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar83 = ZEXT3264(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar82 = ZEXT3264(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar81 = ZEXT3264(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar80 = ZEXT3264(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar79 = ZEXT3264(auVar40);
              }
            }
            uVar39 = vptestmd_avx512vl(local_5cc0,local_5cc0);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar27 = (bool)((byte)uVar39 & 1);
            auVar42._0_4_ =
                 (uint)bVar27 * auVar40._0_4_ | (uint)!bVar27 * *(int *)(local_5d38.ray + 0x100);
            bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar42._4_4_ =
                 (uint)bVar27 * auVar40._4_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 4);
            bVar27 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar42._8_4_ =
                 (uint)bVar27 * auVar40._8_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 8);
            bVar27 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar42._12_4_ =
                 (uint)bVar27 * auVar40._12_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 0xc);
            bVar27 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar42._16_4_ =
                 (uint)bVar27 * auVar40._16_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 0x10);
            bVar27 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar42._20_4_ =
                 (uint)bVar27 * auVar40._20_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 0x14);
            bVar27 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar42._24_4_ =
                 (uint)bVar27 * auVar40._24_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 0x18);
            bVar27 = SUB81(uVar39 >> 7,0);
            auVar42._28_4_ =
                 (uint)bVar27 * auVar40._28_4_ |
                 (uint)!bVar27 * *(int *)((RayK<8> *)(local_5d38.ray + 0x100) + 0x1c);
            *(undefined1 (*) [32])(local_5d38.ray + 0x100) = auVar42;
          }
          bVar28 = (byte)uVar39;
          auVar60._0_4_ =
               (uint)(bVar28 & 1) * *(int *)local_5d48 |
               (uint)!(bool)(bVar28 & 1) * local_5ce0._0_4_;
          bVar27 = (bool)((byte)(uVar39 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar27 * *(int *)(local_5d48 + 4) | (uint)!bVar27 * local_5ce0._4_4_
          ;
          bVar27 = (bool)((byte)(uVar39 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar27 * *(int *)(local_5d48 + 8) | (uint)!bVar27 * local_5ce0._8_4_
          ;
          bVar27 = (bool)((byte)(uVar39 >> 3) & 1);
          auVar60._12_4_ =
               (uint)bVar27 * *(int *)(local_5d48 + 0xc) | (uint)!bVar27 * local_5ce0._12_4_;
          bVar27 = (bool)((byte)(uVar39 >> 4) & 1);
          auVar60._16_4_ =
               (uint)bVar27 * *(int *)(local_5d48 + 0x10) | (uint)!bVar27 * local_5ce0._16_4_;
          bVar27 = (bool)((byte)(uVar39 >> 5) & 1);
          auVar60._20_4_ =
               (uint)bVar27 * *(int *)(local_5d48 + 0x14) | (uint)!bVar27 * local_5ce0._20_4_;
          bVar27 = (bool)((byte)(uVar39 >> 6) & 1);
          auVar60._24_4_ =
               (uint)bVar27 * *(int *)(local_5d48 + 0x18) | (uint)!bVar27 * local_5ce0._24_4_;
          bVar27 = SUB81(uVar39 >> 7,0);
          auVar60._28_4_ =
               (uint)bVar27 * *(int *)(local_5d48 + 0x1c) | (uint)!bVar27 * local_5ce0._28_4_;
          *(undefined1 (*) [32])local_5d48 = auVar60;
          ray = local_5d68;
          uVar39 = local_5d70;
          context = local_5d60;
        }
        uVar30 = CONCAT31((int3)(local_5d58 >> 8),(byte)local_5d58 & ~bVar28);
      }
      lVar36 = lVar36 + 4;
      uVar1 = local_5d4c;
      lVar31 = local_5ce8;
    } while ((char)uVar30 != '\0');
    uVar30 = 0;
LAB_01dd4a02:
    lVar31 = local_5ce8 + 1;
    lVar35 = lVar35 + 0xb0;
    bVar28 = (byte)local_5d4c & (byte)uVar30;
    uVar30 = CONCAT31((int3)(local_5d4c >> 8),bVar28);
  } while (bVar28 != 0);
  uVar30 = 0;
LAB_01dd4a23:
  bVar28 = (byte)local_5d78 | ~(byte)uVar30;
  local_5d78 = (uint)bVar28;
  if (bVar28 == 0xff) {
    bVar28 = 0xff;
    goto LAB_01dd4b77;
  }
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5b00._0_4_ =
       (uint)(bVar28 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar28 & 1) * local_5b00._0_4_;
  bVar27 = (bool)(bVar28 >> 1 & 1);
  local_5b00._4_4_ = (uint)bVar27 * auVar40._4_4_ | (uint)!bVar27 * local_5b00._4_4_;
  bVar27 = (bool)(bVar28 >> 2 & 1);
  local_5b00._8_4_ = (uint)bVar27 * auVar40._8_4_ | (uint)!bVar27 * local_5b00._8_4_;
  bVar27 = (bool)(bVar28 >> 3 & 1);
  local_5b00._12_4_ = (uint)bVar27 * auVar40._12_4_ | (uint)!bVar27 * local_5b00._12_4_;
  bVar27 = (bool)(bVar28 >> 4 & 1);
  local_5b00._16_4_ = (uint)bVar27 * auVar40._16_4_ | (uint)!bVar27 * local_5b00._16_4_;
  bVar27 = (bool)(bVar28 >> 5 & 1);
  local_5b00._20_4_ = (uint)bVar27 * auVar40._20_4_ | (uint)!bVar27 * local_5b00._20_4_;
  bVar27 = (bool)(bVar28 >> 6 & 1);
  local_5b00._24_4_ = (uint)bVar27 * auVar40._24_4_ | (uint)!bVar27 * local_5b00._24_4_;
  local_5b00._28_4_ =
       (uint)(bVar28 >> 7) * auVar40._28_4_ | (uint)!(bool)(bVar28 >> 7) * local_5b00._28_4_;
  goto LAB_01dd3f9d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }